

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostaddress.cpp
# Opt level: O1

bool __thiscall QNetmask::setAddress(QNetmask *this,QHostAddress *address)

{
  byte bVar1;
  uint uVar2;
  QHostAddressPrivate *pQVar3;
  int iVar4;
  byte *pbVar5;
  byte *pbVar6;
  quint8 qVar7;
  long in_FS_OFFSET;
  bool bVar8;
  undefined8 local_28;
  undefined1 *puStack_20;
  long local_18;
  
  pbVar6 = (byte *)&local_28;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  this->length = 0xff;
  pQVar3 = (address->d).d.ptr;
  if (pQVar3->protocol == '\x01') {
    pbVar5 = (byte *)&local_18;
    local_28 = (undefined1 *)(pQVar3->field_1).a6_64.c[0];
    puStack_20 = (undefined1 *)(pQVar3->field_1).a6_64.c[1];
LAB_001ad6fd:
    qVar7 = '\0';
    bVar8 = true;
    do {
      bVar1 = *pbVar6;
      if (bVar1 != 0xff) {
        if (bVar1 < 0xf0) {
          if (0xbf < bVar1) {
            if (bVar1 == 0xc0) goto LAB_001ad783;
            if (bVar1 == 0xe0) goto LAB_001ad781;
            goto LAB_001ad7a6;
          }
          if (bVar1 == 0) break;
          if (bVar1 != 0x80) goto LAB_001ad7a6;
        }
        else {
          if (bVar1 < 0xfc) {
            if (bVar1 != 0xf0) {
              if (bVar1 == 0xf8) goto LAB_001ad77d;
              goto LAB_001ad7a6;
            }
          }
          else {
            if (bVar1 != 0xfc) {
              if (bVar1 != 0xfe) goto LAB_001ad7a6;
              qVar7 = qVar7 + '\x01';
            }
            qVar7 = qVar7 + '\x01';
LAB_001ad77d:
            qVar7 = qVar7 + '\x01';
          }
          qVar7 = qVar7 + '\x01';
LAB_001ad781:
          qVar7 = qVar7 + '\x01';
LAB_001ad783:
          qVar7 = qVar7 + '\x01';
        }
        qVar7 = qVar7 + '\x01';
        break;
      }
      qVar7 = qVar7 + '\b';
      pbVar6 = pbVar6 + 1;
      bVar8 = pbVar6 < pbVar5;
    } while (bVar8);
    if ((!bVar8) || (iVar4 = bcmp(pbVar6 + 1,"",(size_t)(pbVar5 + ~(ulong)pbVar6)), iVar4 == 0)) {
      this->length = qVar7;
      bVar8 = true;
      goto LAB_001ad7af;
    }
  }
  else if (pQVar3->protocol == '\0') {
    pbVar5 = (byte *)((long)&local_28 + 4);
    uVar2 = pQVar3->a;
    local_28 = (undefined1 *)
               CONCAT44(0xaaaaaaaa,
                        uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                        uVar2 << 0x18);
    goto LAB_001ad6fd;
  }
LAB_001ad7a6:
  bVar8 = false;
LAB_001ad7af:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar8;
}

Assistant:

bool QNetmask::setAddress(const QHostAddress &address)
{
    static const quint8 zeroes[16] = { 0 };
    union {
        quint32 v4;
        quint8 v6[16];
    } ip;

    int netmask = 0;
    quint8 *ptr = ip.v6;
    quint8 *end;
    length = 255;

    if (address.protocol() == QHostAddress::IPv4Protocol) {
        ip.v4 = qToBigEndian(address.toIPv4Address());
        end = ptr + 4;
    } else if (address.protocol() == QHostAddress::IPv6Protocol) {
        memcpy(ip.v6, address.toIPv6Address().c, 16);
        end = ptr + 16;
    } else {
        return false;
    }

    while (ptr < end) {
        switch (*ptr) {
        case 255:
            netmask += 8;
            ++ptr;
            continue;

        default:
            return false;       // invalid IP-style netmask

        case 254:
            ++netmask;
            Q_FALLTHROUGH();
        case 252:
            ++netmask;
            Q_FALLTHROUGH();
        case 248:
            ++netmask;
            Q_FALLTHROUGH();
        case 240:
            ++netmask;
            Q_FALLTHROUGH();
        case 224:
            ++netmask;
            Q_FALLTHROUGH();
        case 192:
            ++netmask;
            Q_FALLTHROUGH();
        case 128:
            ++netmask;
            Q_FALLTHROUGH();
        case 0:
            break;
        }
        break;
    }

    // confirm that the rest is only zeroes
    if (ptr < end && memcmp(ptr + 1, zeroes, end - ptr - 1) != 0)
        return false;

    length = netmask;
    return true;
}